

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Sol * exampleA(Sol *__return_storage_ptr__,vector<ride,_std::allocator<ride>_> *rides,long vehs)

{
  reference pvVar1;
  const_reference pvVar2;
  allocator<std::vector<ride,_std::allocator<ride>_>_> local_22;
  undefined1 local_21;
  long local_20;
  long vehs_local;
  vector<ride,_std::allocator<ride>_> *rides_local;
  Sol *sol;
  
  local_21 = 0;
  local_20 = vehs;
  vehs_local = (long)rides;
  rides_local = (vector<ride,_std::allocator<ride>_> *)__return_storage_ptr__;
  std::allocator<std::vector<ride,_std::allocator<ride>_>_>::allocator(&local_22);
  std::
  vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ::vector(__return_storage_ptr__,vehs,&local_22);
  std::allocator<std::vector<ride,_std::allocator<ride>_>_>::~allocator(&local_22);
  pvVar1 = std::
           vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
           ::operator[](__return_storage_ptr__,0);
  pvVar2 = std::vector<ride,_std::allocator<ride>_>::operator[]
                     ((vector<ride,_std::allocator<ride>_> *)vehs_local,0);
  std::vector<ride,_std::allocator<ride>_>::push_back(pvVar1,pvVar2);
  pvVar1 = std::
           vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
           ::operator[](__return_storage_ptr__,1);
  pvVar2 = std::vector<ride,_std::allocator<ride>_>::operator[]
                     ((vector<ride,_std::allocator<ride>_> *)vehs_local,2);
  std::vector<ride,_std::allocator<ride>_>::push_back(pvVar1,pvVar2);
  pvVar1 = std::
           vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
           ::operator[](__return_storage_ptr__,1);
  pvVar2 = std::vector<ride,_std::allocator<ride>_>::operator[]
                     ((vector<ride,_std::allocator<ride>_> *)vehs_local,1);
  std::vector<ride,_std::allocator<ride>_>::push_back(pvVar1,pvVar2);
  return __return_storage_ptr__;
}

Assistant:

Sol exampleA(const vector<ride>& rides, const long vehs) {
    Sol sol(vehs);

    // Example A:
    sol[0].push_back(rides[0]);
    sol[1].push_back(rides[2]);
    sol[1].push_back(rides[1]);

    return sol;
}